

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int htmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  xmlChar *pxVar1;
  xmlOutputBufferPtr buf_00;
  htmlDocPtr doc_00;
  bool bVar2;
  int iVar3;
  xmlDocPtr doc;
  int switched_encoding;
  xmlOutputBufferPtr buf;
  xmlChar *encoding;
  xmlChar *oldctxtenc;
  xmlChar *oldenc;
  xmlNodePtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  oldctxtenc = (xmlChar *)0x0;
  pxVar1 = ctxt->encoding;
  buf = (xmlOutputBufferPtr)ctxt->encoding;
  buf_00 = ctxt->buf;
  bVar2 = false;
  xmlInitParser();
  doc_00 = cur->doc;
  if (doc_00 != (htmlDocPtr)0x0) {
    oldctxtenc = doc_00->encoding;
    if (ctxt->encoding == (xmlChar *)0x0) {
      if (doc_00->encoding != (xmlChar *)0x0) {
        buf = (xmlOutputBufferPtr)doc_00->encoding;
      }
    }
    else {
      doc_00->encoding = ctxt->encoding;
    }
  }
  if ((buf != (xmlOutputBufferPtr)0x0) && (doc_00 != (htmlDocPtr)0x0)) {
    htmlSetMetaEncoding(doc_00,(xmlChar *)buf);
  }
  if ((buf == (xmlOutputBufferPtr)0x0) && (doc_00 != (htmlDocPtr)0x0)) {
    buf = (xmlOutputBufferPtr)htmlGetMetaEncoding(doc_00);
  }
  if (buf == (xmlOutputBufferPtr)0x0) {
    buf = (xmlOutputBufferPtr)anon_var_dwarf_d6f2;
  }
  if ((((buf != (xmlOutputBufferPtr)0x0) && (pxVar1 == (xmlChar *)0x0)) &&
      (buf_00->encoder == (xmlCharEncodingHandlerPtr)0x0)) && (buf_00->conv == (xmlBufPtr)0x0)) {
    iVar3 = xmlSaveSwitchEncoding(ctxt,(char *)buf);
    if (iVar3 < 0) {
      doc_00->encoding = oldctxtenc;
      return -1;
    }
    bVar2 = true;
  }
  if ((ctxt->options & 1U) == 0) {
    htmlNodeDumpFormatOutput(buf_00,doc_00,cur,(char *)buf,0);
  }
  else {
    htmlNodeDumpFormatOutput(buf_00,doc_00,cur,(char *)buf,1);
  }
  if ((bVar2) && (pxVar1 == (xmlChar *)0x0)) {
    xmlSaveClearEncoding(ctxt);
  }
  if (doc_00 != (htmlDocPtr)0x0) {
    doc_00->encoding = oldctxtenc;
  }
  return 0;
}

Assistant:

static int
htmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    const xmlChar *oldenc = NULL;
    const xmlChar *oldctxtenc = ctxt->encoding;
    const xmlChar *encoding = ctxt->encoding;
    xmlOutputBufferPtr buf = ctxt->buf;
    int switched_encoding = 0;
    xmlDocPtr doc;

    DEBUG_ENTER(("htmlNodeDumpOutputInternal(%p, %p);\n", ctxt, cur));

    xmlInitParser();

    doc = cur->doc;
    if (doc != NULL) {
        oldenc = doc->encoding;
	if (ctxt->encoding != NULL) {
	    doc->encoding = BAD_CAST ctxt->encoding;
	} else if (doc->encoding != NULL) {
	    encoding = doc->encoding;
	}
    }

    if ((encoding != NULL) && (doc != NULL))
	htmlSetMetaEncoding(doc, (const xmlChar *) encoding);
    if ((encoding == NULL) && (doc != NULL))
	encoding = htmlGetMetaEncoding(doc);
    if (encoding == NULL)
	encoding = BAD_CAST "HTML";
    if ((encoding != NULL) && (oldctxtenc == NULL) &&
	(buf->encoder == NULL) && (buf->conv == NULL)) {
	if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
	    doc->encoding = oldenc;
	    RETURN_INT(-1);
	}
	switched_encoding = 1;
    }
    if (ctxt->options & XML_SAVE_FORMAT)
	htmlNodeDumpFormatOutput(buf, doc, cur,
				       (const char *)encoding, 1);
    else
	htmlNodeDumpFormatOutput(buf, doc, cur,
				       (const char *)encoding, 0);
    /*
     * Restore the state of the saving context at the end of the document
     */
    if ((switched_encoding) && (oldctxtenc == NULL)) {
	xmlSaveClearEncoding(ctxt);
    }
    if (doc != NULL)
	doc->encoding = oldenc;
    RETURN_INT(0);
}